

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O2

wchar_t archive_read_format_lha_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long *plVar1;
  lzh_stream *strm;
  wchar_t wVar2;
  lzh_br *br;
  wchar_t *pwVar3;
  char cVar4;
  wchar_t wVar5;
  int64_t *piVar6;
  long *plVar7;
  lzh_dec *ds;
  uchar *puVar8;
  uint64_t uVar9;
  long lVar10;
  long lVar11;
  uint16_t uVar12;
  uint uVar13;
  wchar_t wVar14;
  wchar_t wVar15;
  wchar_t wVar16;
  wchar_t wVar17;
  int iVar18;
  wchar_t wVar19;
  wchar_t wVar20;
  void *pvVar21;
  undefined4 *puVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  wchar_t tbl_bits;
  wchar_t tbl_bits_00;
  char *fmt;
  byte bVar26;
  size_t len;
  uchar *puVar27;
  wchar_t wVar28;
  huffman_conflict *hf;
  size_t __size;
  byte local_e0;
  lzh_br local_b8;
  huffman_conflict *local_a8;
  long *local_a0;
  void **local_98;
  wchar_t *local_90;
  uchar *local_88;
  wchar_t *local_80;
  long *local_78;
  size_t *local_70;
  huffman_conflict *local_68;
  uchar *local_60;
  long local_58;
  lzh_br *local_50;
  huffman_conflict *local_48;
  int *local_40;
  long local_38;
  
  piVar6 = (int64_t *)a->format->data;
  local_98 = buff;
  if (piVar6[2] != 0) {
    __archive_read_consume(a,piVar6[2]);
    piVar6[2] = 0;
  }
  if (*(char *)((long)piVar6 + 0x124) != '\0') {
    if (*(char *)((long)piVar6 + 0x125) == '\0') {
      if (((*(byte *)(piVar6 + 8) & 8) != 0) &&
         (*(short *)((long)piVar6 + 0xc2) != (short)piVar6[3])) {
        archive_set_error(&a->archive,-1,"LHa data CRC error");
        return L'\xffffffec';
      }
      *(undefined1 *)((long)piVar6 + 0x125) = 1;
    }
    *offset = *piVar6;
    *size = 0;
    *local_98 = (void *)0x0;
    return L'\x01';
  }
  plVar7 = (long *)a->format->data;
  local_70 = size;
  if (*(char *)((long)piVar6 + 0x126) == '\0') {
    if (plVar7[1] == 0) {
      *local_98 = (void *)0x0;
      *size = 0;
      *offset = *plVar7;
      *(undefined1 *)((long)plVar7 + 0x124) = 1;
      return L'\0';
    }
    pvVar21 = __archive_read_ahead(a,1,(ssize_t *)&local_b8);
    *local_98 = pvVar21;
    if (0 < (long)local_b8.cache_buffer) {
      if (plVar7[1] < (long)local_b8.cache_buffer) {
        local_b8.cache_buffer = plVar7[1];
      }
      uVar9 = local_b8.cache_buffer;
      uVar12 = lha_crc16(*(uint16_t *)(plVar7 + 3),pvVar21,local_b8.cache_buffer);
      *(uint16_t *)(plVar7 + 3) = uVar12;
      *local_70 = uVar9;
      lVar24 = *plVar7;
      *offset = lVar24;
      *plVar7 = lVar24 + uVar9;
      plVar1 = plVar7 + 1;
      *plVar1 = *plVar1 - uVar9;
      if (*plVar1 == 0) {
        *(undefined1 *)((long)plVar7 + 0x124) = 1;
      }
      plVar7[2] = uVar9;
      return L'\0';
    }
    fmt = "Truncated LHa file data";
  }
  else {
    if (plVar7[0x25] == 0) {
      plVar7[0x26] = 0x10000;
      pvVar21 = malloc(0x10000);
      plVar7[0x25] = (long)pvVar21;
      if (pvVar21 == (void *)0x0) {
        fmt = "No memory for lzh decompression";
        iVar18 = 0xc;
        goto LAB_0012f64b;
      }
    }
    if (*(char *)((long)plVar7 + 0x123) == '\0') {
      puVar22 = (undefined4 *)plVar7[0x35];
      if (puVar22 == (undefined4 *)0x0) {
        puVar22 = (undefined4 *)calloc(1,0x158);
        plVar7[0x35] = (long)puVar22;
        if (puVar22 != (undefined4 *)0x0) goto LAB_0012f55f;
      }
      else {
LAB_0012f55f:
        puVar22[0x55] = 0xffffffe7;
        if ((*(char *)((long)plVar7 + 0x29) != 'l') || (*(char *)((long)plVar7 + 0x2a) != 'h')) {
LAB_0012f5c0:
          *local_98 = (void *)0x0;
          *local_70 = 0;
          *offset = 0;
          archive_set_error(&a->archive,0x54,"Unsupported lzh compression method -%c%c%c-",
                            (ulong)(uint)(int)*(char *)((long)plVar7 + 0x29),
                            (ulong)(uint)(int)*(char *)((long)plVar7 + 0x2a),
                            (ulong)(uint)(int)*(char *)((long)plVar7 + 0x2b));
          archive_read_format_lha_read_data_skip(a);
          return L'\xffffffec';
        }
        cVar4 = *(char *)((long)plVar7 + 0x2b);
        if (cVar4 == '5') {
          bVar26 = 0;
          iVar18 = 0xd;
LAB_00130285:
          local_e0 = 0;
        }
        else {
          if (cVar4 != '7') {
            if (cVar4 != '6') goto LAB_0012f5c0;
            iVar18 = 0xf;
            bVar26 = 1;
            goto LAB_00130285;
          }
          iVar18 = 0x10;
          local_e0 = 1;
          bVar26 = 0;
        }
        uVar25 = 1 << (sbyte)iVar18;
        puVar22[0x55] = 0xffffffe2;
        uVar13 = puVar22[1];
        puVar22[1] = uVar25;
        puVar22[2] = uVar25 - 1;
        pvVar21 = *(void **)(puVar22 + 4);
        if (uVar13 == uVar25 && pvVar21 != (void *)0x0) {
          __size = (size_t)uVar13;
        }
        else {
          free(pvVar21);
          __size = (size_t)(int)puVar22[1];
          pvVar21 = malloc(__size);
          *(void **)(puVar22 + 4) = pvVar21;
          if (pvVar21 == (void *)0x0) goto LAB_00130363;
        }
        memset(pvVar21,0x20,__size);
        puVar22[6] = 0;
        puVar22[9] = 0;
        *puVar22 = 0;
        puVar22[0x4f] = iVar18 + 1;
        puVar22[0x50] = (bVar26 | local_e0) | 4;
        *(undefined8 *)(puVar22 + 0x51) = 0x500000013;
        *(undefined8 *)(puVar22 + 10) = 0;
        puVar22[0xc] = 0;
        wVar20 = lzh_huffman_init((huffman_conflict *)(puVar22 + 0xe),0x1fe,tbl_bits);
        if (wVar20 == L'\0') {
          puVar22[0x10] = 9;
          wVar20 = lzh_huffman_init((huffman_conflict *)(puVar22 + 0x2e),0x13,tbl_bits_00);
          if (wVar20 == L'\0') {
            puVar22[0x55] = 0;
            *(undefined1 *)((long)plVar7 + 0x123) = 1;
            plVar7[0x33] = 0;
            plVar7[0x34] = 0;
            goto LAB_0012f415;
          }
        }
      }
LAB_00130363:
      fmt = "Couldn\'t allocate memory for lzh decompression";
      iVar18 = 0xc;
      goto LAB_0012f64b;
    }
LAB_0012f415:
    pvVar21 = __archive_read_ahead(a,1,&local_38);
    plVar7[0x2f] = (long)pvVar21;
    if (0 < local_38) {
      lVar24 = plVar7[1];
      if (lVar24 < local_38) {
        local_38 = lVar24;
      }
      lVar11 = local_38;
      plVar7[0x30] = local_38;
      plVar7[0x31] = 0;
      if (plVar7[0x33] == 0) {
        *(int *)(plVar7 + 0x32) = (int)plVar7[0x25];
        *(undefined4 *)((long)plVar7 + 0x194) = *(undefined4 *)((long)plVar7 + 300);
        *(int *)(plVar7 + 0x33) = (int)plVar7[0x26];
        *(undefined4 *)((long)plVar7 + 0x19c) = *(undefined4 *)((long)plVar7 + 0x134);
      }
      iVar18 = ((int *)plVar7[0x35])[0x55];
      local_78 = plVar7;
      if (iVar18 == 0) {
        strm = (lzh_stream *)(plVar7 + 0x2f);
        local_a0 = offset;
        local_40 = (int *)plVar7[0x35];
LAB_0012f678:
        ds = (lzh_dec *)local_78[0x35];
        local_68 = &ds->pt;
        br = &ds->br;
        if (*local_40 < 9) {
          local_90 = (ds->pt).freq;
          local_a8 = &ds->lt;
          local_80 = (ds->lt).freq;
          wVar20 = ds->state;
          hf = local_68;
switchD_0012f6f1_default:
          switch(wVar20) {
          case L'\0':
            wVar20 = (ds->br).cache_avail;
            if (wVar20 < L'\x10') {
              wVar20 = lzh_br_fillup(strm,br);
              if (wVar20 != L'\0') {
                wVar20 = (ds->br).cache_avail;
                goto LAB_0012f719;
              }
              iVar18 = 0;
              if (lVar11 != lVar24) goto LAB_001303c9;
              if ((ds->br).cache_avail < L'\b') {
                if ((ds->w_pos < L'\x01') ||
                   (wVar20 = lzh_copy_from_window(strm,ds), iVar18 = 0, wVar20 != L'\0')) {
                  iVar18 = 1;
                }
                goto LAB_001303c9;
              }
            }
            else {
LAB_0012f719:
              wVar20 = wVar20 + L'\xfffffff0';
              uVar23 = (ds->br).cache_buffer >> ((byte)wVar20 & 0x3f);
              ds->blocks_avail = (uint)uVar23 & 0xffff;
              if ((uVar23 & 0xffff) != 0) {
                (ds->br).cache_avail = wVar20;
                wVar16 = ds->literal_pt_len_bits;
                (ds->pt).len_size = ds->literal_pt_len_size;
                (ds->pt).len_bits = wVar16;
                ds->reading_position = L'\0';
                goto LAB_0012f77e;
              }
            }
            break;
          case L'\x01':
            wVar20 = (ds->br).cache_avail;
            wVar16 = (ds->pt).len_bits;
LAB_0012f77e:
            if (wVar16 <= wVar20) {
LAB_0012f7b6:
              wVar15 = (uint)cache_masks[wVar16] &
                       (uint)((ds->br).cache_buffer >> ((byte)(wVar20 - wVar16) & 0x3f));
              (ds->pt).len_avail = wVar15;
              (ds->br).cache_avail = wVar20 - wVar16;
              goto LAB_0012f7dc;
            }
            wVar15 = lzh_br_fillup(strm,br);
            wVar20 = (ds->br).cache_avail;
            wVar16 = (ds->pt).len_bits;
            if (wVar16 <= wVar20 || wVar15 != L'\0') goto LAB_0012f7b6;
            if (lVar11 == lVar24) break;
            ds->state = L'\x01';
            goto LAB_001303c2;
          case L'\x02':
            wVar15 = (ds->pt).len_avail;
LAB_0012f7dc:
            if (wVar15 == L'\0') {
              wVar20 = (ds->br).cache_avail;
              wVar15 = (ds->pt).len_bits;
              if (wVar20 < wVar15) {
                wVar16 = lzh_br_fillup(strm,br);
                wVar20 = (ds->br).cache_avail;
                wVar15 = (ds->pt).len_bits;
                if (wVar20 < wVar15 && wVar16 == L'\0') {
                  if (lVar11 != lVar24) {
                    ds->state = L'\x02';
                    goto LAB_001303c2;
                  }
                  break;
                }
              }
              wVar20 = lzh_make_fake_table(hf,(ushort)(br->cache_buffer >>
                                                      ((char)wVar20 - (char)wVar15 & 0x3fU)) &
                                              cache_masks[wVar15]);
              if (wVar20 != L'\0') {
                pwVar3 = &(ds->br).cache_avail;
                *pwVar3 = *pwVar3 - (ds->pt).len_bits;
                wVar20 = (uint)(ds->reading_position != L'\0') * 4 + L'\x05';
                goto LAB_0012fd23;
              }
              break;
            }
            wVar16 = hf->len_size;
            if (wVar16 < wVar15) break;
            ds->loop = L'\0';
            local_90[0xc] = L'\0';
            local_90[0xd] = L'\0';
            local_90[0xe] = L'\0';
            local_90[0xf] = L'\0';
            local_90[8] = L'\0';
            local_90[9] = L'\0';
            local_90[10] = L'\0';
            local_90[0xb] = L'\0';
            local_90[0x10] = L'\0';
            local_90[4] = L'\0';
            local_90[5] = L'\0';
            local_90[6] = L'\0';
            local_90[7] = L'\0';
            local_90[0] = L'\0';
            local_90[1] = L'\0';
            local_90[2] = L'\0';
            local_90[3] = L'\0';
            wVar20 = L'\x04';
            if ((L'\x02' < wVar15) && (wVar15 = L'\0', wVar16 != ds->pos_pt_len_size))
            goto LAB_0012f8db;
            goto LAB_0012fd23;
          case L'\x03':
            wVar15 = ds->loop;
LAB_0012f8db:
            wVar20 = lzh_read_pt_bitlen(strm,wVar15,L'\x03');
            ds->loop = wVar20;
            if (wVar20 < L'\x03') {
              if ((lVar11 != lVar24) && (L'\xffffffff' < wVar20)) {
LAB_0013053e:
                ds->state = L'\x03';
                goto LAB_001303c2;
              }
            }
            else {
              wVar20 = (ds->br).cache_avail;
              if (wVar20 < L'\x02') {
                wVar15 = lzh_br_fillup(strm,br);
                wVar20 = (ds->br).cache_avail;
                if (wVar20 < L'\x02' && wVar15 == L'\0') {
                  if (lVar11 != lVar24) goto LAB_0013053e;
                  break;
                }
              }
              uVar13 = (uint)((ds->br).cache_buffer >> ((byte)(wVar20 + L'\xfffffffe') & 0x3f));
              uVar25 = uVar13 & 3;
              (ds->br).cache_avail = wVar20 + L'\xfffffffe';
              if ((int)uVar25 <= (ds->pt).len_avail + L'\xfffffffd') {
                wVar20 = uVar25 + L'\x03';
                for (uVar23 = 0; (uVar13 & 3) != uVar23; uVar23 = uVar23 + 1) {
                  (ds->pt).bitlen[uVar23 + 3] = '\0';
                }
                ds->loop = wVar20;
                goto LAB_0012f983;
              }
            }
            break;
          case L'\x04':
            wVar20 = ds->loop;
LAB_0012f983:
            wVar20 = lzh_read_pt_bitlen(strm,wVar20,(ds->pt).len_avail);
            ds->loop = wVar20;
            if (wVar20 < (ds->pt).len_avail) {
              if ((lVar11 != lVar24) && (L'\xffffffff' < wVar20)) {
                ds->state = L'\x04';
                goto LAB_001303c2;
              }
            }
            else {
              wVar20 = lzh_make_huffman_table(hf);
              if (wVar20 != L'\0') {
                wVar20 = L'\t';
                if (ds->reading_position != L'\0') goto LAB_0012fd23;
                goto switchD_0012f6f1_caseD_5;
              }
            }
            break;
          case L'\x05':
switchD_0012f6f1_caseD_5:
            wVar15 = (ds->br).cache_avail;
            wVar16 = (ds->lt).len_bits;
            if (wVar15 < wVar16) {
              wVar20 = lzh_br_fillup(strm,br);
              wVar15 = (ds->br).cache_avail;
              wVar16 = (ds->lt).len_bits;
              if (wVar15 < wVar16 && wVar20 == L'\0') {
                if (lVar11 != lVar24) {
                  ds->state = L'\x05';
                  goto LAB_001303c2;
                }
                break;
              }
            }
            wVar20 = (uint)cache_masks[wVar16] &
                     (uint)((ds->br).cache_buffer >> ((byte)(wVar15 - wVar16) & 0x3f));
            (ds->lt).len_avail = wVar20;
            (ds->br).cache_avail = wVar15 - wVar16;
            goto LAB_0012fa2f;
          case L'\x06':
            wVar20 = (ds->lt).len_avail;
LAB_0012fa2f:
            if (wVar20 != L'\0') {
              if (wVar20 <= local_a8->len_size) {
                ds->loop = L'\0';
                local_80[0xc] = L'\0';
                local_80[0xd] = L'\0';
                local_80[0xe] = L'\0';
                local_80[0xf] = L'\0';
                local_80[8] = L'\0';
                local_80[9] = L'\0';
                local_80[10] = L'\0';
                local_80[0xb] = L'\0';
                local_80[4] = L'\0';
                local_80[5] = L'\0';
                local_80[6] = L'\0';
                local_80[7] = L'\0';
                local_80[0] = L'\0';
                local_80[1] = L'\0';
                local_80[2] = L'\0';
                local_80[3] = L'\0';
                local_80[0x10] = L'\0';
                wVar20 = L'\0';
LAB_0012faf2:
                while (wVar15 = (ds->lt).len_avail, wVar20 < wVar15) {
                  wVar16 = (ds->br).cache_avail;
                  wVar15 = (ds->pt).max_bits;
                  if (wVar16 < wVar15) {
                    wVar14 = lzh_br_fillup(strm,br);
                    wVar16 = (ds->br).cache_avail;
                    wVar15 = (ds->pt).max_bits;
                    if (wVar15 <= wVar16 || wVar14 != L'\0') goto LAB_0012fb3f;
                    if (lVar11 == lVar24) goto LAB_0013025d;
LAB_001303b2:
                    ds->loop = wVar20;
                    ds->state = L'\a';
                    goto LAB_001303c2;
                  }
LAB_0012fb3f:
                  wVar15 = lzh_decode_huffman(hf,(uint)cache_masks[wVar15] &
                                                 (uint)(br->cache_buffer >>
                                                       ((char)wVar16 - (char)wVar15 & 0x3fU)));
                  offset = local_a0;
                  if ((uint)wVar15 < 3) {
                    if (wVar15 == L'\0') {
                      puVar27 = (ds->lt).bitlen;
                      (ds->br).cache_avail = wVar16 - (uint)*(ds->pt).bitlen;
                      puVar27[wVar20] = '\0';
                      wVar20 = wVar20 + L'\x01';
                    }
                    else {
                      uVar13 = (uint)(wVar15 != L'\x01');
                      puVar27 = (uchar *)((ulong)uVar13 * 5 + 4);
                      bVar26 = (ds->pt).bitlen[(uint)wVar15];
                      uVar25 = (uint)bVar26;
                      if (wVar16 < uVar13 * 5 + (uint)bVar26 + L'\x04') {
                        local_88 = puVar27;
                        wVar16 = lzh_br_fillup(strm,br);
                        puVar8 = (ds->pt).bitlen;
                        puVar27 = local_88;
                        if (wVar16 == L'\0') {
                          wVar16 = (ds->br).cache_avail;
                          bVar26 = puVar8[(uint)wVar15];
                          uVar25 = (uint)bVar26;
                          if (wVar16 < (int)((int)local_88 + (uint)bVar26)) {
                            offset = local_a0;
                            if (lVar11 != lVar24) goto LAB_001303b2;
                            goto LAB_0013025d;
                          }
                        }
                        else {
                          uVar25 = (uint)puVar8[(uint)wVar15];
                          wVar16 = (ds->br).cache_avail;
                        }
                      }
                      hf = local_68;
                      offset = local_a0;
                      wVar16 = (((uint)(wVar15 == L'\x01') * 5 + -9) - uVar25) + wVar16;
                      uVar25 = (uint)cache_masks[(ulong)puVar27 & 0xffffffff] &
                               (uint)((ds->br).cache_buffer >> ((byte)wVar16 & 0x3f));
                      uVar13 = uVar25 + 3;
                      if (wVar15 != L'\x01') {
                        uVar13 = uVar25 + 0x14;
                      }
                      (ds->br).cache_avail = wVar16;
                      if ((ds->lt).len_avail < wVar20 + uVar13) goto LAB_0013025d;
                      memset((ds->lt).bitlen + wVar20,0,(ulong)uVar13);
                      wVar20 = wVar20 + uVar13;
                    }
                  }
                  else {
                    (ds->br).cache_avail = wVar16 - (uint)(ds->pt).bitlen[(uint)wVar15];
                    pwVar3 = (ds->lt).freq + (uint)(wVar15 + L'\xfffffffe');
                    *pwVar3 = *pwVar3 + L'\x01';
                    (ds->lt).bitlen[wVar20] = (uchar)(wVar15 + L'\xfffffffe');
                    wVar20 = wVar20 + L'\x01';
                  }
                }
                if ((wVar20 <= wVar15) &&
                   (wVar20 = lzh_make_huffman_table(local_a8), wVar20 != L'\0')) {
switchD_0012f6f1_caseD_8:
                  wVar20 = ds->pos_pt_len_bits;
                  (ds->pt).len_size = ds->pos_pt_len_size;
                  (ds->pt).len_bits = wVar20;
                  ds->reading_position = L'\x01';
                  wVar20 = L'\x01';
                  goto LAB_0012fd23;
                }
              }
              break;
            }
            wVar20 = (ds->br).cache_avail;
            wVar15 = (ds->lt).len_bits;
            if (wVar20 < wVar15) {
              wVar16 = lzh_br_fillup(strm,br);
              wVar20 = (ds->br).cache_avail;
              wVar15 = (ds->lt).len_bits;
              if (wVar20 < wVar15 && wVar16 == L'\0') {
                if (lVar11 == lVar24) break;
                ds->state = L'\x06';
LAB_001303c2:
                iVar18 = 0;
                goto LAB_001303c9;
              }
            }
            wVar20 = lzh_make_fake_table(local_a8,(ushort)(br->cache_buffer >>
                                                          ((char)wVar20 - (char)wVar15 & 0x3fU)) &
                                                  cache_masks[wVar15]);
            if (wVar20 == L'\0') break;
            pwVar3 = &(ds->br).cache_avail;
            *pwVar3 = *pwVar3 - (ds->lt).len_bits;
            wVar20 = L'\b';
LAB_0012fd23:
            ds->state = wVar20;
            goto switchD_0012f6f1_default;
          case L'\a':
            wVar20 = ds->loop;
            goto LAB_0012faf2;
          case L'\b':
            goto switchD_0012f6f1_caseD_8;
          case L'\t':
            goto switchD_0012f6f1_caseD_9;
          default:
            goto switchD_0012f6f1_default;
          }
LAB_0013025d:
          ds->error = L'\xffffffe7';
          iVar18 = -0x19;
          goto LAB_001303c9;
        }
        local_b8.cache_buffer = (ds->br).cache_buffer;
        local_b8.cache_avail = (ds->br).cache_avail;
        local_b8._12_4_ = *(undefined4 *)&(ds->br).field_0xc;
        local_88 = ds->w_buff;
        local_80 = (wchar_t *)(ds->lt).bitlen;
        local_60 = (ds->pt).bitlen;
        local_a8 = (huffman_conflict *)CONCAT44(local_a8._4_4_,ds->blocks_avail);
        wVar20 = ds->copy_len;
        wVar15 = ds->copy_pos;
        wVar16 = ds->w_pos;
        wVar14 = ds->w_mask;
        wVar28 = ds->state;
        wVar5 = ds->w_size;
        local_90 = (wchar_t *)(long)(ds->lt).max_bits;
        local_58 = (long)(ds->pt).max_bits;
        local_50 = br;
        if ((ds->w_remaining < L'\x01') || (wVar17 = lzh_copy_from_window(strm,ds), wVar17 != L'\0')
           ) {
          local_48 = &ds->lt;
switchD_0012fdfa_default:
          do {
            switch(wVar28) {
            case L'\t':
              iVar18 = (wchar_t)local_a8;
              do {
                if (iVar18 == 0) {
                  ds->state = L'\0';
                  *(undefined4 *)&local_50->cache_buffer = (undefined4)local_b8.cache_buffer;
                  *(undefined4 *)((long)&local_50->cache_buffer + 4) = local_b8.cache_buffer._4_4_;
                  local_50->cache_avail = local_b8.cache_avail;
                  *(undefined4 *)&local_50->field_0xc = local_b8._12_4_;
                  ds->blocks_avail = L'\0';
                  ds->w_pos = wVar16;
                  ds->copy_pos = L'\0';
                  iVar18 = 100;
                  goto LAB_001301ef;
                }
                local_a8 = (huffman_conflict *)CONCAT44(local_a8._4_4_,iVar18);
                wVar28 = local_b8.cache_avail;
                if (local_b8.cache_avail < (wchar_t)local_90) {
                  wVar20 = lzh_br_fillup(strm,&local_b8);
                  wVar28 = local_b8.cache_avail;
                  if ((wVar20 != L'\0') || ((wchar_t)local_90 <= local_b8.cache_avail))
                  goto LAB_0012fea2;
                  if (lVar11 != lVar24) goto LAB_00130183;
                  wVar20 = lzh_decode_huffman(local_48,(uint)cache_masks[(long)local_90] &
                                                       (uint)(local_b8.cache_buffer <<
                                                             ((char)local_90 -
                                                              (char)local_b8.cache_avail & 0x3fU)));
                  wVar28 = wVar28 - (uint)*(byte *)((long)local_80 + (ulong)(uint)wVar20);
                  local_b8.cache_avail = wVar28;
                  if (wVar28 < L'\0') goto LAB_00130213;
                }
                else {
LAB_0012fea2:
                  wVar20 = lzh_decode_huffman(local_48,(uint)cache_masks[(long)local_90] &
                                                       (uint)(local_b8.cache_buffer >>
                                                             ((char)wVar28 - (char)local_90 & 0x3fU)
                                                             ));
                  wVar28 = wVar28 - (uint)*(byte *)((long)local_80 + (ulong)(uint)wVar20);
                  local_b8.cache_avail = wVar28;
                }
                if (0xff < (uint)wVar20) goto LAB_0012ff45;
                local_88[wVar16] = (uchar)wVar20;
                wVar16 = wVar16 + L'\x01';
                if (wVar5 <= wVar16) {
                  ds->w_remaining = wVar5;
                  wVar20 = lzh_copy_from_window(strm,ds);
                  wVar16 = L'\0';
                  if (wVar20 == L'\0') {
                    local_a8 = (huffman_conflict *)CONCAT44(local_a8._4_4_,(wchar_t)local_a8 + -1);
                    wVar16 = L'\0';
                    wVar28 = L'\t';
                    goto LAB_001301c8;
                  }
                }
                iVar18 = (wchar_t)local_a8 + -1;
              } while( true );
            case L'\n':
              wVar28 = local_b8.cache_avail;
              goto LAB_0012ff50;
            case L'\v':
              goto LAB_0013001d;
            case L'\f':
              goto switchD_0012fdfa_caseD_c;
            }
          } while( true );
        }
LAB_001301c8:
        *(undefined4 *)&local_50->cache_buffer = (undefined4)local_b8.cache_buffer;
        *(undefined4 *)((long)&local_50->cache_buffer + 4) = local_b8.cache_buffer._4_4_;
        local_50->cache_avail = local_b8.cache_avail;
        *(undefined4 *)&local_50->field_0xc = local_b8._12_4_;
        ds->blocks_avail = (wchar_t)local_a8;
        ds->state = wVar28;
        ds->w_pos = wVar16;
        iVar18 = 0;
        goto LAB_001301ef;
      }
      lVar24 = 0;
LAB_001303f6:
      plVar7 = local_78;
      if (iVar18 != 0) {
        if (iVar18 != 1) {
          archive_set_error(&a->archive,-1,"Bad lzh data");
          return L'\xffffffe7';
        }
        *(undefined1 *)((long)local_78 + 0x124) = 1;
      }
      local_78[2] = lVar24;
      local_78[1] = local_78[1] - lVar24;
      if ((local_78[0x33] == 0) || (*(char *)((long)local_78 + 0x124) != '\0')) {
        *offset = *local_78;
        pvVar21 = (void *)local_78[0x25];
        len = local_78[0x32] - (long)pvVar21;
        *local_70 = len;
        *local_98 = pvVar21;
        uVar12 = lha_crc16(*(uint16_t *)(local_78 + 3),pvVar21,len);
        *(uint16_t *)(plVar7 + 3) = uVar12;
        *plVar7 = *plVar7 + len;
      }
      else {
        *offset = *local_78;
        *local_70 = 0;
        *local_98 = (void *)0x0;
      }
      return L'\0';
    }
    fmt = "Truncated LHa file body";
  }
  iVar18 = 0x54;
LAB_0012f64b:
  archive_set_error(&a->archive,iVar18,fmt);
  return L'\xffffffe2';
switchD_0012f6f1_caseD_9:
  iVar18 = 100;
LAB_001301ef:
  if (iVar18 != 100) goto LAB_001303c9;
  goto LAB_0012f678;
LAB_0012ff45:
  wVar20 = wVar20 + L'\xffffff03';
  local_a8 = (huffman_conflict *)CONCAT44(local_a8._4_4_,(wchar_t)local_a8 + -1);
LAB_0012ff50:
  lVar10 = local_58;
  wVar15 = (wchar_t)local_58;
  cVar4 = (char)local_58;
  if (wVar28 < wVar15) {
    wVar17 = lzh_br_fillup(strm,&local_b8);
    wVar28 = local_b8.cache_avail;
    if ((wVar17 != L'\0') || (wVar15 <= local_b8.cache_avail)) goto LAB_0012ffd6;
    if (lVar11 != lVar24) {
      ds->copy_len = wVar20;
      wVar28 = L'\n';
      goto LAB_001301c8;
    }
    wVar15 = lzh_decode_huffman(local_68,(uint)cache_masks[lVar10] &
                                         (uint)(local_b8.cache_buffer <<
                                               (cVar4 - (char)local_b8.cache_avail & 0x3fU)));
    local_b8.cache_avail = wVar28 - (uint)local_60[(uint)wVar15];
    if (wVar28 - (uint)local_60[(uint)wVar15] < L'\0') goto LAB_00130213;
  }
  else {
LAB_0012ffd6:
    wVar15 = lzh_decode_huffman(local_68,(uint)cache_masks[lVar10] &
                                         (uint)(local_b8.cache_buffer >>
                                               ((char)wVar28 - cVar4 & 0x3fU)));
    local_b8.cache_avail = wVar28 - (uint)local_60[(uint)wVar15];
  }
LAB_0013001d:
  if (L'\x01' < wVar15) {
    wVar28 = wVar15 + L'\xffffffff';
    if (local_b8.cache_avail < wVar28) {
      wVar17 = lzh_br_fillup(strm,&local_b8);
      if ((wVar17 == L'\0') && (local_b8.cache_avail < wVar28)) {
        if (lVar11 != lVar24) {
          ds->copy_len = wVar20;
          ds->copy_pos = wVar15;
          wVar28 = L'\v';
          goto LAB_001301c8;
        }
LAB_00130213:
        ds->error = L'\xffffffe7';
        iVar18 = -0x19;
        goto LAB_001301ef;
      }
    }
    wVar15 = ((uint)cache_masks[(uint)wVar28] &
             (uint)(local_b8.cache_buffer >> ((byte)(local_b8.cache_avail - wVar28) & 0x3f))) +
             (1 << ((byte)wVar28 & 0x1f));
    local_b8.cache_avail = local_b8.cache_avail - wVar28;
  }
  wVar15 = ~wVar15 + wVar16 & wVar14;
switchD_0012fdfa_caseD_c:
  do {
    wVar28 = wVar16;
    if (wVar16 < wVar15) {
      wVar28 = wVar15;
    }
    wVar28 = wVar5 - wVar28;
    wVar17 = wVar28;
    if (wVar20 < wVar28) {
      wVar17 = wVar20;
    }
    wVar2 = wVar17 + wVar15;
    if ((wVar2 < wVar16) || (wVar16 + wVar17 < wVar15)) {
      memcpy(local_88 + wVar16,local_88 + wVar15,(long)wVar17);
    }
    else {
      for (uVar23 = 0; (uint)wVar17 != uVar23; uVar23 = uVar23 + 1) {
        (local_88 + wVar16)[uVar23] = (local_88 + wVar15)[uVar23];
      }
    }
    wVar16 = wVar16 + wVar17 & wVar14;
    if (wVar16 == L'\0') {
      ds->w_remaining = wVar5;
      wVar19 = lzh_copy_from_window(strm,ds);
      if (wVar19 == L'\0') {
        wVar16 = L'\0';
        offset = local_a0;
        if (wVar28 < wVar20) {
          ds->copy_len = wVar20 - wVar17;
          ds->copy_pos = wVar2 & wVar14;
          wVar28 = L'\f';
        }
        else {
LAB_00130183:
          wVar28 = L'\t';
        }
        goto LAB_001301c8;
      }
    }
    if (wVar20 <= wVar28) break;
    wVar20 = wVar20 - wVar17;
    wVar15 = wVar2 & wVar14;
  } while( true );
  wVar28 = L'\t';
  offset = local_a0;
  goto switchD_0012fdfa_default;
LAB_001303c9:
  lVar24 = (lVar11 - local_78[0x30]) + local_78[0x31];
  local_78[0x31] = lVar24;
  goto LAB_001303f6;
}

Assistant:

static int
archive_read_format_lha_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	struct lha *lha = (struct lha *)(a->format->data);
	int r;

	if (lha->entry_unconsumed) {
		/* Consume as much as the decompressor actually used. */
		__archive_read_consume(a, lha->entry_unconsumed);
		lha->entry_unconsumed = 0;
	}
	if (lha->end_of_entry) {
		if (!lha->end_of_entry_cleanup) {
			if ((lha->setflag & CRC_IS_SET) &&
			    lha->crc != lha->entry_crc_calculated) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "LHa data CRC error");
				return (ARCHIVE_WARN);
			}

			/* End-of-entry cleanup done. */
			lha->end_of_entry_cleanup = 1;
		}
		*offset = lha->entry_offset;
		*size = 0;
		*buff = NULL;
		return (ARCHIVE_EOF);
	}

	if (lha->entry_is_compressed)
		r =  lha_read_data_lzh(a, buff, size, offset);
	else
		/* No compression. */
		r =  lha_read_data_none(a, buff, size, offset);
	return (r);
}